

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O0

int ncnn::binary_op_broadcast_outer<ncnn::BinaryOp_x86_functor::binary_op_min>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined1 auVar1 [16];
  int *piVar2;
  long *in_RDX;
  binary_op_min *in_RSI;
  long *in_RDI;
  float fVar3;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  __m128 afVar4;
  int x_3;
  __m128 _outp_1;
  __m128 _b_1;
  __m128 _p_1;
  int x_2;
  float *ptr1_1;
  int y1;
  int y_1;
  int z1;
  int z;
  float *outptr_1;
  float *ptr_1;
  int q;
  int x_1;
  __m128 _outp;
  __m128 _b;
  __m128 _p;
  int x;
  float *outptr;
  float *ptr1;
  float *ptr;
  int y;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  binary_op_min op;
  Mat *m;
  Mat *m_1;
  float *in_stack_fffffffffffffb28;
  binary_op_min *in_stack_fffffffffffffb30;
  binary_op_min *this;
  int local_45c;
  undefined8 uStack_450;
  float local_448 [2];
  float afStack_440 [2];
  float local_438 [2];
  float afStack_430 [5];
  int local_41c;
  undefined8 local_418;
  undefined8 local_410;
  undefined8 local_408;
  undefined4 local_400;
  long local_3f8;
  undefined4 local_3f0;
  undefined4 local_3ec;
  undefined4 local_3e8;
  undefined4 local_3e4;
  undefined4 local_3e0;
  undefined8 local_3d8;
  float *local_3d0;
  int local_3c8;
  int local_3c4;
  int local_3c0;
  int local_3bc;
  int local_3b8;
  int local_3b4;
  undefined8 local_3b0;
  undefined8 local_3a8;
  undefined8 local_3a0;
  undefined4 local_398;
  long local_390;
  undefined4 local_388;
  undefined4 local_384;
  undefined4 local_380;
  undefined4 local_37c;
  undefined4 local_378;
  undefined8 local_370;
  float *local_368;
  undefined8 local_360;
  undefined8 local_358;
  undefined8 local_350;
  undefined4 local_348;
  long local_340;
  undefined4 local_338;
  undefined4 local_334;
  undefined4 local_330;
  undefined4 local_32c;
  undefined4 local_328;
  undefined8 local_320;
  float *local_318;
  int local_310;
  int local_30c;
  undefined1 local_308 [16];
  float local_2f8 [2];
  float afStack_2f0 [2];
  float local_2e8 [2];
  float afStack_2e0 [3];
  int local_2d4;
  float *local_2d0;
  float *local_2c8;
  float *local_2c0;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  int local_2a8;
  int local_2a4;
  int local_2a0;
  binary_op_min local_299 [9];
  long *local_290;
  binary_op_min *local_288;
  long *local_280;
  undefined1 local_275;
  int local_274;
  undefined8 *local_268;
  undefined8 *local_260;
  binary_op_min *local_258;
  undefined8 *local_248;
  undefined8 *local_240;
  undefined8 *local_238;
  undefined1 local_22d;
  int local_22c;
  undefined8 *local_220;
  undefined8 *local_210;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  long lStack_1d0;
  undefined4 local_1c4;
  long local_1c0;
  float *local_1b8;
  undefined4 local_1ac;
  int local_1a8;
  int local_1a4;
  undefined8 *local_1a0;
  long local_198;
  undefined4 local_18c;
  long local_188;
  float *local_180;
  undefined4 local_174;
  int local_170;
  int local_16c;
  undefined8 *local_168;
  undefined4 local_15c;
  long local_158;
  undefined4 local_14c;
  long local_148;
  undefined8 *local_128;
  undefined8 *local_118;
  undefined8 *local_108;
  int local_c4;
  undefined8 *local_c0;
  int local_b4;
  long *local_b0;
  int local_a4;
  long *local_a0;
  float *local_98;
  float *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  float *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  float *local_50;
  int local_44;
  undefined8 *local_38;
  long local_30;
  undefined4 local_24;
  long local_20;
  long local_18;
  undefined4 local_10;
  int local_c;
  undefined8 *local_8;
  
  local_2a0 = *(int *)((long)in_RDI + 0x2c);
  local_2a4 = (int)in_RDI[6];
  local_2a8 = *(int *)((long)in_RDI + 0x34);
  local_2ac = (int)in_RDI[7];
  local_2b0 = (int)in_RDI[3];
  local_290 = in_RDX;
  local_288 = in_RSI;
  local_280 = in_RDI;
  if ((int)in_RDI[5] == 2) {
    for (local_2b4 = 0; local_2b4 < local_2a4; local_2b4 = local_2b4 + 1) {
      local_b0 = local_280;
      local_b4 = local_2b4;
      local_2c0 = (float *)(*local_280 +
                           (long)*(int *)((long)local_280 + 0x2c) * (long)local_2b4 * local_280[2]);
      local_258 = local_288;
      local_2c8 = *(float **)local_288;
      local_a0 = local_290;
      local_a4 = local_2b4;
      local_2d0 = (float *)(*local_290 +
                           (long)*(int *)((long)local_290 + 0x2c) * (long)local_2b4 * local_290[2]);
      if (local_2b0 == 4) {
        for (local_2d4 = 0; local_2d4 < local_2a0; local_2d4 = local_2d4 + 1) {
          local_90 = local_2c0;
          local_2e8 = *(float (*) [2])local_2c0;
          afStack_2e0._0_8_ = *(undefined8 *)(local_2c0 + 2);
          local_1e8 = *local_2c8;
          local_2f8[1] = local_1e8;
          local_2f8[0] = local_1e8;
          afStack_2f0[1] = local_1e8;
          afStack_2f0[0] = local_1e8;
          fStack_1e4 = local_1e8;
          fStack_1e0 = local_1e8;
          fStack_1dc = local_1e8;
          local_1d8 = local_1e8;
          afVar4 = BinaryOp_x86_functor::binary_op_min::func_pack4
                             (local_299,(__m128 *)local_2e8,(__m128 *)local_2f8);
          local_68 = afVar4._0_8_;
          local_308._8_4_ = extraout_XMM0_Dc;
          local_308._0_8_ = local_68;
          local_308._12_4_ = extraout_XMM0_Dd;
          local_50 = local_2d0;
          uStack_60 = local_308._8_8_;
          *(undefined8 *)local_2d0 = local_68;
          *(undefined8 *)(local_2d0 + 2) = local_308._8_8_;
          local_2c0 = local_2c0 + 4;
          local_2c8 = local_2c8 + 1;
          local_2d0 = local_2d0 + 4;
        }
      }
      if (local_2b0 == 1) {
        for (local_30c = 0; local_30c < local_2a0; local_30c = local_30c + 1) {
          fVar3 = BinaryOp_x86_functor::binary_op_min::func
                            (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,(float *)0x10703e2)
          ;
          *local_2d0 = fVar3;
          local_2c0 = local_2c0 + 1;
          local_2c8 = local_2c8 + 1;
          local_2d0 = local_2d0 + 1;
        }
      }
    }
  }
  if (((int)local_280[5] == 3) || ((int)local_280[5] == 4)) {
    for (local_310 = 0; local_310 < local_2ac; local_310 = local_310 + 1) {
      local_268 = &local_360;
      local_16c = *(int *)((long)local_280 + 0x2c);
      local_170 = (int)local_280[6];
      local_174 = *(undefined4 *)((long)local_280 + 0x34);
      local_318 = (float *)(*local_280 + local_280[8] * (long)local_310 * local_280[2]);
      local_188 = local_280[2];
      local_18c = (undefined4)local_280[3];
      local_198 = local_280[4];
      local_168 = &local_360;
      local_158 = (long)local_16c * (long)local_170 * local_188;
      local_260 = &local_360;
      local_248 = &local_360;
      local_220 = &local_3b0;
      local_1a4 = *(int *)((long)local_290 + 0x2c);
      local_1a8 = (int)local_290[6];
      local_1ac = *(undefined4 *)((long)local_290 + 0x34);
      local_368 = (float *)(*local_290 + local_290[8] * (long)local_310 * local_290[2]);
      local_1c0 = local_290[2];
      local_1c4 = (undefined4)local_290[3];
      lStack_1d0 = local_290[4];
      local_1a0 = &local_3b0;
      local_148 = (long)local_1a4 * (long)local_1a8 * local_1c0;
      local_210 = &local_3b0;
      local_240 = &local_3b0;
      local_328 = 0;
      local_32c = 0;
      local_330 = 0;
      local_334 = 0;
      local_348 = 0;
      local_350 = 0;
      local_358 = 0;
      local_360 = 0;
      local_14c = 0x10;
      local_15c = 0x10;
      local_22c = local_310;
      local_22d = 1;
      local_274 = local_310;
      local_275 = 1;
      local_320 = 0;
      local_338 = 0;
      local_3b0 = 0;
      local_3a0 = 0;
      local_398 = 0;
      local_388 = 0;
      local_384 = 0;
      local_380 = 0;
      local_37c = 0;
      local_378 = 0;
      local_370 = 0;
      local_3a8 = 0;
      local_1b8 = local_368;
      local_180 = local_318;
      local_118 = local_240;
      local_108 = local_248;
      local_390 = lStack_1d0;
      local_340 = local_198;
      for (local_3b4 = 0; local_3b4 < local_2a8; local_3b4 = local_3b4 + 1) {
        local_3bc = *(int *)(local_288 + 0x34) + -1;
        piVar2 = std::min<int>(&local_3b4,&local_3bc);
        local_3b8 = *piVar2;
        for (local_3c0 = 0; local_3c0 < local_2a4; local_3c0 = local_3c0 + 1) {
          local_3c8 = *(int *)(local_288 + 0x30) + -1;
          piVar2 = std::min<int>(&local_3c0,&local_3c8);
          local_3c4 = *piVar2;
          local_38 = &local_418;
          local_c = *(int *)(local_288 + 0x2c);
          local_10 = *(undefined4 *)(local_288 + 0x30);
          local_18 = *(long *)local_288 +
                     (long)*(int *)(local_288 + 0x2c) * (long)*(int *)(local_288 + 0x30) *
                     (long)local_3b8 * *(long *)(local_288 + 0x10);
          local_20 = *(long *)(local_288 + 0x10);
          local_24 = *(undefined4 *)(local_288 + 0x18);
          local_30 = *(long *)(local_288 + 0x20);
          local_8 = &local_418;
          local_c0 = &local_418;
          local_3d0 = (float *)(local_18 + (long)local_c * (long)local_3c4 * local_20);
          local_238 = &local_418;
          local_44 = local_3b8;
          local_418 = 0;
          local_408 = 0;
          local_400 = 0;
          local_3f0 = 0;
          local_3ec = 0;
          local_3e8 = 0;
          local_3e4 = 0;
          local_3e0 = 0;
          local_3d8 = 0;
          local_410 = 0;
          this = local_288;
          local_128 = local_238;
          local_c4 = local_3c4;
          local_3f8 = local_30;
          if (local_2b0 == 4) {
            for (local_41c = 0; local_41c < local_2a0; local_41c = local_41c + 1) {
              local_98 = local_318;
              local_438 = *(float (*) [2])local_318;
              afStack_430._0_8_ = *(undefined8 *)(local_318 + 2);
              local_208 = *local_3d0;
              local_448[1] = local_208;
              local_448[0] = local_208;
              afStack_440[1] = local_208;
              afStack_440[0] = local_208;
              fStack_204 = local_208;
              fStack_200 = local_208;
              fStack_1fc = local_208;
              local_1f8 = local_208;
              afVar4 = BinaryOp_x86_functor::binary_op_min::func_pack4
                                 (local_299,(__m128 *)local_438,(__m128 *)local_448);
              local_88 = afVar4._0_8_;
              auVar1._8_4_ = extraout_XMM0_Dc_00;
              auVar1._0_8_ = local_88;
              auVar1._12_4_ = extraout_XMM0_Dd_00;
              local_70 = local_368;
              uStack_450 = auVar1._8_8_;
              uStack_80 = uStack_450;
              *(undefined8 *)local_368 = local_88;
              *(undefined8 *)(local_368 + 2) = uStack_450;
              local_318 = local_318 + 4;
              local_3d0 = local_3d0 + 1;
              local_368 = local_368 + 4;
            }
          }
          if (local_2b0 == 1) {
            for (local_45c = 0; local_45c < local_2a0; local_45c = local_45c + 1) {
              fVar3 = BinaryOp_x86_functor::binary_op_min::func
                                (this,in_stack_fffffffffffffb28,(float *)0x107116f);
              *local_368 = fVar3;
              local_318 = local_318 + 1;
              local_3d0 = local_3d0 + 1;
              local_368 = local_368 + 1;
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static int binary_op_broadcast_outer(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;

    if (a.dims == 2)
    {
        // type 14
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int y = 0; y < h; y++)
        {
            const float* ptr = a.row(y);
            const float* ptr1 = b;
            float* outptr = c.row(y);

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (elempack == 16)
            {
                for (int x = 0; x < w; x++)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _b = _mm512_set1_ps(*ptr1);
                    __m512 _outp = op.func_pack16(_p, _b);
                    _mm512_storeu_ps(outptr, _outp);
                    ptr += 16;
                    ptr1 += 1;
                    outptr += 16;
                }
            }
#endif // __AVX512F__
            if (elempack == 8)
            {
                for (int x = 0; x < w; x++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _b = _mm256_set1_ps(*ptr1);
                    __m256 _outp = op.func_pack8(_p, _b);
                    _mm256_storeu_ps(outptr, _outp);
                    ptr += 8;
                    ptr1 += 1;
                    outptr += 8;
                }
            }
#endif // __AVX__
            if (elempack == 4)
            {
                for (int x = 0; x < w; x++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _b = _mm_set1_ps(*ptr1);
                    __m128 _outp = op.func_pack4(_p, _b);
                    _mm_storeu_ps(outptr, _outp);
                    ptr += 4;
                    ptr1 += 1;
                    outptr += 4;
                }
            }
#endif // __SSE2__
            if (elempack == 1)
            {
                for (int x = 0; x < w; x++)
                {
                    *outptr = op.func(*ptr, *ptr1);
                    ptr += 1;
                    ptr1 += 1;
                    outptr += 1;
                }
            }
        }
    }

    if (a.dims == 3 || a.dims == 4)
    {
        // type 15 16 17 18 19
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = a.channel(q);
            float* outptr = c.channel(q);

            for (int z = 0; z < d; z++)
            {
                int z1 = std::min(z, b.d - 1);
                for (int y = 0; y < h; y++)
                {
                    int y1 = std::min(y, b.h - 1);

                    const float* ptr1 = b.depth(z1).row(y1);

#if __SSE2__
#if __AVX__
#if __AVX512F__
                    if (elempack == 16)
                    {
                        for (int x = 0; x < w; x++)
                        {
                            __m512 _p = _mm512_loadu_ps(ptr);
                            __m512 _b = _mm512_set1_ps(*ptr1);
                            __m512 _outp = op.func_pack16(_p, _b);
                            _mm512_storeu_ps(outptr, _outp);
                            ptr += 16;
                            ptr1 += 1;
                            outptr += 16;
                        }
                    }
#endif // __AVX512F__
                    if (elempack == 8)
                    {
                        for (int x = 0; x < w; x++)
                        {
                            __m256 _p = _mm256_loadu_ps(ptr);
                            __m256 _b = _mm256_set1_ps(*ptr1);
                            __m256 _outp = op.func_pack8(_p, _b);
                            _mm256_storeu_ps(outptr, _outp);
                            ptr += 8;
                            ptr1 += 1;
                            outptr += 8;
                        }
                    }
#endif // __AVX__
                    if (elempack == 4)
                    {
                        for (int x = 0; x < w; x++)
                        {
                            __m128 _p = _mm_loadu_ps(ptr);
                            __m128 _b = _mm_set1_ps(*ptr1);
                            __m128 _outp = op.func_pack4(_p, _b);
                            _mm_storeu_ps(outptr, _outp);
                            ptr += 4;
                            ptr1 += 1;
                            outptr += 4;
                        }
                    }
#endif // __SSE2__
                    if (elempack == 1)
                    {
                        for (int x = 0; x < w; x++)
                        {
                            *outptr = op.func(*ptr, *ptr1);
                            ptr += 1;
                            ptr1 += 1;
                            outptr += 1;
                        }
                    }
                }
            }
        }
    }

    return 0;
}